

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O3

bool tcu::isNearestMipmapLinearCompareResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               TexComparePrecision *prec,Vec2 *coord,int coordZ,Vec2 *fBounds,float cmpReference,
               float result)

{
  undefined8 uVar1;
  int dim;
  int dim_00;
  int dim_01;
  int dim_02;
  CompareMode compareMode;
  int c;
  bool isFixedPoint;
  CmpResultSet CVar2;
  CmpResultSet CVar3;
  int iVar4;
  int iVar5;
  int i;
  int j;
  uint uVar6;
  uint uVar7;
  int c_00;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float cmpValue_;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float d0;
  float d1;
  Vec2 uBounds1;
  Vec2 uBounds0;
  Vec2 vBounds1;
  Vec2 vBounds0;
  float local_a8;
  float fStack_a4;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&level0->m_format);
  dim = (level0->m_size).m_data[0];
  dim_00 = (level0->m_size).m_data[1];
  dim_01 = (level1->m_size).m_data[0];
  dim_02 = (level1->m_size).m_data[1];
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_48,sampler->normalizedCoords,dim,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_50,sampler->normalizedCoords,dim_01,coord->m_data[0],
             (prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,dim_00,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,dim_02,coord->m_data[1],
             (prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar9 = floorf(local_48);
  fVar10 = floorf(local_44);
  fVar11 = floorf(local_50);
  fVar12 = floorf(local_4c);
  fVar13 = floorf(local_38);
  c_00 = (int)fVar13;
  fVar13 = floorf(local_34);
  fVar14 = floorf(local_40);
  fVar15 = floorf(local_3c);
  if (c_00 <= (int)fVar13) {
    c = (int)fVar9;
    do {
      for (; c <= (int)fVar10; c = c + 1) {
        iVar4 = TexVerifierUtil::wrap(sampler->wrapS,c,dim);
        iVar5 = TexVerifierUtil::wrap(sampler->wrapT,c_00,dim_00);
        cmpValue_ = lookupDepth(level0,sampler,iVar4,iVar5,coordZ);
        for (iVar4 = (int)fVar14; iVar5 = (int)fVar11, iVar4 <= (int)fVar15; iVar4 = iVar4 + 1) {
          for (; iVar5 <= (int)fVar12; iVar5 = iVar5 + 1) {
            i = TexVerifierUtil::wrap(sampler->wrapS,iVar5,dim_01);
            j = TexVerifierUtil::wrap(sampler->wrapT,iVar4,dim_02);
            fVar16 = lookupDepth(level1,sampler,i,j,coordZ);
            compareMode = sampler->compare;
            CVar2 = execCompare(compareMode,cmpValue_,cmpReference,prec->referenceBits,isFixedPoint)
            ;
            CVar3 = execCompare(compareMode,fVar16,cmpReference,prec->referenceBits,isFixedPoint);
            uVar1 = *(undefined8 *)fBounds->m_data;
            fVar16 = TexVerifierUtil::computeFixedPointError(prec->pcfBits);
            fVar17 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
            local_a8 = (float)uVar1;
            fStack_a4 = (float)((ulong)uVar1 >> 0x20);
            uVar7 = 0;
            bVar8 = true;
            uVar6 = 0xffffffff;
            do {
              if ((uVar6 & ((ushort)CVar3 >> 7 & 2 | (ushort)CVar2 >> 8 & 1) |
                  uVar7 & ((ushort)CVar2 & 1) + ((ushort)CVar3 & 1) * 2) == 3) {
                fVar20 = 0.0;
                fVar18 = 0.0;
                if ((uVar7 & 1) != 0) {
                  fVar18 = 1.0;
                }
                if (1 < uVar7) {
                  fVar20 = 1.0;
                }
                fVar19 = fVar18 * (1.0 - local_a8) + fVar20 * local_a8;
                fVar18 = fVar18 * (1.0 - fStack_a4) + fVar20 * fStack_a4;
                if (((float)(~-(uint)(fVar19 <= fVar18) & (uint)fVar18 |
                            -(uint)(fVar19 <= fVar18) & (uint)fVar19) - (fVar17 + fVar16) <= result)
                   && (result <= (float)(~-(uint)(fVar18 <= fVar19) & (uint)fVar18 |
                                        (uint)fVar19 & -(uint)(fVar18 <= fVar19)) + fVar17 + fVar16)
                   ) break;
              }
              bVar8 = uVar7 < 3;
              uVar7 = uVar7 + 1;
              uVar6 = uVar6 - 1;
            } while (uVar7 != 4);
            if (bVar8) {
              return true;
            }
          }
        }
      }
      c_00 = c_00 + 1;
      c = (int)fVar9;
    } while (c_00 <= (int)fVar13);
  }
  return false;
}

Assistant:

static bool isNearestMipmapLinearCompareResultValid (const ConstPixelBufferAccess&	level0,
													 const ConstPixelBufferAccess&	level1,
													 const Sampler&					sampler,
													 const TexComparePrecision&		prec,
													 const Vec2&					coord,
													 const int						coordZ,
													 const Vec2&					fBounds,
													 const float					cmpReference,
													 const float					result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(level0.getFormat());

	const int	w0					= level0.getWidth();
	const int	w1					= level1.getWidth();
	const int	h0					= level0.getHeight();
	const int	h1					= level1.getHeight();

	const Vec2	uBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	uBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1,	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds0			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h0,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());
	const Vec2	vBounds1			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, h1,	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinates - without wrap mode
	const int	minI0				= deFloorFloatToInt32(uBounds0.x());
	const int	maxI0				= deFloorFloatToInt32(uBounds0.y());
	const int	minI1				= deFloorFloatToInt32(uBounds1.x());
	const int	maxI1				= deFloorFloatToInt32(uBounds1.y());
	const int	minJ0				= deFloorFloatToInt32(vBounds0.x());
	const int	maxJ0				= deFloorFloatToInt32(vBounds0.y());
	const int	minJ1				= deFloorFloatToInt32(vBounds1.x());
	const int	maxJ1				= deFloorFloatToInt32(vBounds1.y());

	for (int j0 = minJ0; j0 <= maxJ0; j0++)
	{
		for (int i0 = minI0; i0 <= maxI0; i0++)
		{
			const float	depth0	= lookupDepth(level0, sampler, wrap(sampler.wrapS, i0, w0), wrap(sampler.wrapT, j0, h0), coordZ);

			for (int j1 = minJ1; j1 <= maxJ1; j1++)
			{
				for (int i1 = minI1; i1 <= maxI1; i1++)
				{
					const float	depth1	= lookupDepth(level1, sampler, wrap(sampler.wrapS, i1, w1), wrap(sampler.wrapT, j1, h1), coordZ);

					if (isLinearCompareValid(sampler.compare, prec, Vec2(depth0, depth1), fBounds, cmpReference, result, isFixedPointDepth))
						return true;
				}
			}
		}
	}

	return false;
}